

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_lazy_ior(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  undefined1 uVar1;
  _Bool _Var2;
  run_container_t *local_40;
  container_t *result;
  uint8_t *result_type_local;
  array_container_t *paStack_28;
  uint8_t type2_local;
  container_t *c2_local;
  array_container_t *paStack_18;
  uint8_t type1_local;
  container_t *c1_local;
  
  result = result_type;
  result_type_local._7_1_ = type2;
  paStack_28 = (array_container_t *)c2;
  c2_local._7_1_ = type1;
  paStack_18 = (array_container_t *)c1;
  if (type1 != '\x04') {
    paStack_28 = (array_container_t *)
                 container_unwrap_shared(c2,(uint8_t *)((long)&result_type_local + 7));
    local_40 = (run_container_t *)0x0;
    switch((result_type_local._7_1_ - 5) + (uint)c2_local._7_1_ * 4) {
    case 0:
      bitset_container_or((bitset_container_t *)paStack_18,(bitset_container_t *)paStack_28,
                          (bitset_container_t *)paStack_18);
      if (paStack_18->cardinality == 0x10000) {
        c1_local = run_container_create_range(0,0x10000);
        *(undefined1 *)result = 3;
      }
      else {
        *(undefined1 *)result = 1;
        c1_local = paStack_18;
      }
      break;
    case 1:
      array_bitset_container_lazy_union
                (paStack_28,(bitset_container_t *)paStack_18,(bitset_container_t *)paStack_18);
      *(undefined1 *)result = 1;
      c1_local = paStack_18;
      break;
    case 2:
      _Var2 = run_container_is_full((run_container_t *)paStack_28);
      if (_Var2) {
        local_40 = run_container_create();
        *(undefined1 *)result = 3;
        run_container_copy((run_container_t *)paStack_28,local_40);
        c1_local = local_40;
      }
      else {
        run_bitset_container_lazy_union
                  ((run_container_t *)paStack_28,(bitset_container_t *)paStack_18,
                   (bitset_container_t *)paStack_18);
        *(undefined1 *)result = 1;
        c1_local = paStack_18;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x15d6,
                    "container_t *container_lazy_ior(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                   );
    case 4:
      local_40 = (run_container_t *)bitset_container_create();
      *(undefined1 *)result = 1;
      array_bitset_container_lazy_union
                (paStack_18,(bitset_container_t *)paStack_28,(bitset_container_t *)local_40);
      c1_local = local_40;
      break;
    case 5:
      _Var2 = array_array_container_lazy_inplace_union(paStack_18,paStack_28,&local_40);
      uVar1 = 2;
      if (_Var2) {
        uVar1 = 1;
      }
      *(undefined1 *)result = uVar1;
      if ((local_40 == (run_container_t *)0x0) && (*result == '\x02')) {
        c1_local = paStack_18;
      }
      else {
        c1_local = local_40;
      }
      break;
    case 6:
      local_40 = run_container_create();
      array_run_container_union(paStack_18,(run_container_t *)paStack_28,local_40);
      *(undefined1 *)result = 3;
      c1_local = local_40;
      break;
    case 8:
      _Var2 = run_container_is_full((run_container_t *)paStack_18);
      if (_Var2) {
        *(undefined1 *)result = 3;
        c1_local = paStack_18;
      }
      else {
        local_40 = (run_container_t *)bitset_container_create();
        run_bitset_container_lazy_union
                  ((run_container_t *)paStack_18,(bitset_container_t *)paStack_28,
                   (bitset_container_t *)local_40);
        *(undefined1 *)result = 1;
        c1_local = local_40;
      }
      break;
    case 9:
      array_run_container_inplace_union(paStack_28,(run_container_t *)paStack_18);
      *(undefined1 *)result = 3;
      c1_local = paStack_18;
      break;
    case 10:
      run_container_union_inplace((run_container_t *)paStack_18,(run_container_t *)paStack_28);
      *(undefined1 *)result = 3;
      c1_local = convert_run_to_efficient_container((run_container_t *)paStack_18,(uint8_t *)result)
      ;
    }
    return c1_local;
  }
  __assert_fail("type1 != SHARED_CONTAINER_TYPE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x156a,
                "container_t *container_lazy_ior(container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
               );
}

Assistant:

static inline container_t *container_lazy_ior(
    container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    assert(type1 != SHARED_CONTAINER_TYPE);
    // c1 = get_writable_copy_if_shared(c1,&type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
#ifdef LAZY_OR_BITSET_CONVERSION_TO_FULL
            // if we have two bitsets, we might as well compute the cardinality
            bitset_container_or(const_CAST_bitset(c1),
                                const_CAST_bitset(c2),
                                CAST_bitset(c1));
            // it is possible that two bitsets can lead to a full container
            if (CAST_bitset(c1)->cardinality == (1 << 16)) {  // we convert
                result = run_container_create_range(0, (1 << 16));
                *result_type = RUN_CONTAINER_TYPE;
                return result;
            }
#else
            bitset_container_or_nocard(const_CAST_bitset(c1),
                                       const_CAST_bitset(c2),
                                       CAST_bitset(c1));

#endif
            *result_type = BITSET_CONTAINER_TYPE;
            return c1;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            *result_type = array_array_container_lazy_inplace_union(
                                CAST_array(c1),
                                const_CAST_array(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            if((result == NULL)
               && (*result_type == ARRAY_CONTAINER_TYPE)) {
                 return c1; // the computation was done in-place!
            }
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            run_container_union_inplace(CAST_run(c1),
                                        const_CAST_run(c2));
            *result_type = RUN_CONTAINER_TYPE;
            return convert_run_to_efficient_container(CAST_run(c1),
                                                      result_type);

        case CONTAINER_PAIR(BITSET,ARRAY):
            array_bitset_container_lazy_union(
                    const_CAST_array(c2), const_CAST_bitset(c1),
                    CAST_bitset(c1));              // is lazy
            *result_type = BITSET_CONTAINER_TYPE;  // never array
            return c1;

        case CONTAINER_PAIR(ARRAY,BITSET):
            // c1 is an array, so no in-place possible
            result = bitset_container_create();
            *result_type = BITSET_CONTAINER_TYPE;
            array_bitset_container_lazy_union(
                    const_CAST_array(c1), const_CAST_bitset(c2),
                    CAST_bitset(result));  // is lazy
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            if (run_container_is_full(const_CAST_run(c2))) {
                result = run_container_create();
                *result_type = RUN_CONTAINER_TYPE;
                run_container_copy(const_CAST_run(c2),
                                   CAST_run(result));
                return result;
            }
            run_bitset_container_lazy_union(
                const_CAST_run(c2), const_CAST_bitset(c1),
                CAST_bitset(c1));  // allowed //  lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return c1;

        case CONTAINER_PAIR(RUN,BITSET):
            if (run_container_is_full(const_CAST_run(c1))) {
                *result_type = RUN_CONTAINER_TYPE;
                return c1;
            }
            result = bitset_container_create();
            run_bitset_container_lazy_union(
                const_CAST_run(c1), const_CAST_bitset(c2),
                CAST_bitset(result));  //  lazy
            *result_type = BITSET_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = run_container_create();
            array_run_container_union(const_CAST_array(c1),
                                      const_CAST_run(c2),
                                      CAST_run(result));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container_and_free(result,
            // result_type);
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            array_run_container_inplace_union(const_CAST_array(c2),
                                              CAST_run(c1));
            *result_type = RUN_CONTAINER_TYPE;
            // next line skipped since we are lazy
            // result = convert_run_to_efficient_container_and_free(result,
            // result_type);
            return c1;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}